

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

Gia_Man_t * Gia_ManDupNoMuxes(Gia_Man_t *p,int fSkipBufs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar6;
  long lVar7;
  
  if ((p->pMuxes == (uint *)0x0) && (p->nXors == 0)) {
    __assert_fail("p->pMuxes != NULL || Gia_ManXorNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xa6,"Gia_Man_t *Gia_ManDupNoMuxes(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(5000);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  p->pObjs->Value = 0;
  Gia_ManHashStart(p_00);
  for (lVar7 = 1; lVar7 < p->nObjs; lVar7 = lVar7 + 1) {
    pObj = Gia_ManObj(p,(int)lVar7);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar1 = (uint)*(undefined8 *)pObj;
    if ((~uVar1 & 0x9fffffff) == 0) {
      uVar1 = Gia_ManAppendCi(p_00);
LAB_001fc1ce:
      pObj->Value = uVar1;
    }
    else {
      if ((~uVar1 & 0x1fffffff) != 0 && (int)uVar1 < 0) {
        iVar2 = Gia_ObjFanin0Copy(pObj);
        uVar1 = Gia_ManAppendCo(p_00,iVar2);
        goto LAB_001fc1ce;
      }
      iVar2 = Gia_ObjIsBuf(pObj);
      if (iVar2 != 0) {
        uVar1 = Gia_ObjFanin0Copy(pObj);
        if (fSkipBufs == 0) {
          uVar1 = Gia_ManAppendBuf(p_00,uVar1);
        }
        goto LAB_001fc1ce;
      }
      if ((p->pMuxes == (uint *)0x0) || (p->pMuxes[lVar7] == 0)) {
        iVar2 = Gia_ObjIsXor(pObj);
        iVar3 = Gia_ObjFanin0Copy(pObj);
        iVar4 = Gia_ObjFanin1Copy(pObj);
        if (iVar2 == 0) {
          uVar1 = Gia_ManHashAnd(p_00,iVar3,iVar4);
        }
        else {
          uVar1 = Gia_ManHashXor(p_00,iVar3,iVar4);
        }
      }
      else {
        iVar2 = Gia_ObjFanin2Copy(p,pObj);
        iVar3 = Gia_ObjFanin1Copy(pObj);
        iVar4 = Gia_ObjFanin0Copy(pObj);
        uVar1 = Gia_ManHashMux(p_00,iVar2,iVar3,iVar4);
      }
      pObj->Value = uVar1;
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupNoMuxes( Gia_Man_t * p, int fSkipBufs )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pMuxes != NULL || Gia_ManXorNum(p) );
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = fSkipBufs ? Gia_ObjFanin0Copy(pObj) : Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}